

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void compress(uint64_t *state,uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  ulong uVar16;
  uint64_t uVar17;
  ulong uVar18;
  ulong uVar19;
  uint64_t uVar20;
  ulong uVar21;
  uint64_t uVar22;
  ulong auStack_330 [8];
  long local_2f0 [5];
  ulong local_2c8 [83];
  
  uVar1 = *state;
  uVar2 = state[1];
  uVar3 = state[2];
  uVar4 = state[3];
  uVar5 = state[4];
  uVar6 = state[5];
  uVar7 = state[6];
  uVar8 = state[7];
  lVar9 = 0;
  do {
    uVar10 = *(ulong *)(buf + lVar9 * 8);
    local_2c8[lVar9 + 2] =
         uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
         (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10);
  lVar9 = 0x10;
  do {
    uVar10 = auStack_330[lVar9];
    uVar11 = local_2c8[lVar9];
    local_2c8[lVar9 + 2] =
         local_2c8[2] + local_2f0[lVar9] +
         (uVar10 >> 7 ^
         (uVar10 << 0x38 | uVar10 >> 8) ^ (uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f)) +
         (uVar11 >> 6 ^ (uVar11 << 3 | uVar11 >> 0x3d) ^ (uVar11 << 0x2d | uVar11 >> 0x13));
    lVar9 = lVar9 + 1;
    local_2c8[2] = uVar10;
  } while (lVar9 != 0x50);
  uVar18 = 0xfffffffffffffff8;
  uVar10 = uVar2;
  uVar11 = uVar8;
  uVar12 = uVar1;
  uVar13 = uVar7;
  uVar15 = uVar3;
  uVar17 = uVar4;
  uVar20 = uVar5;
  uVar22 = uVar6;
  do {
    lVar9 = ((uVar13 ^ uVar22) & uVar20 ^ uVar13) + uVar11 +
            ((uVar20 << 0x17 | uVar20 >> 0x29) ^
            (uVar20 << 0x2e | uVar20 >> 0x12) ^ (uVar20 << 0x32 | uVar20 >> 0xe)) +
            round_key[uVar18 + 8] + local_2c8[uVar18 + 10];
    uVar16 = uVar17 + lVar9;
    uVar11 = (uVar10 & uVar12 | (uVar10 | uVar12) & uVar15) +
             ((uVar12 << 0x19 | uVar12 >> 0x27) ^
             (uVar12 << 0x1e | uVar12 >> 0x22) ^ (uVar12 << 0x24 | uVar12 >> 0x1c)) + lVar9;
    lVar9 = uVar13 + round_key[uVar18 + 9] + local_2c8[uVar18 + 0xb] +
            ((uVar22 ^ uVar20) & uVar16 ^ uVar22) +
            ((uVar16 * 0x800000 | uVar16 >> 0x29) ^
            (uVar16 << 0x2e | uVar16 >> 0x12) ^ (uVar16 << 0x32 | uVar16 >> 0xe));
    uVar14 = uVar15 + lVar9;
    uVar13 = lVar9 + (uVar11 & uVar12 | (uVar11 | uVar12) & uVar10) +
                     ((uVar11 * 0x2000000 | uVar11 >> 0x27) ^
                     (uVar11 * 0x40000000 | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c));
    lVar9 = uVar22 + round_key[uVar18 + 10] + local_2c8[uVar18 + 0xc] +
            ((uVar16 ^ uVar20) & uVar14 ^ uVar20) +
            ((uVar14 * 0x800000 | uVar14 >> 0x29) ^
            (uVar14 << 0x2e | uVar14 >> 0x12) ^ (uVar14 << 0x32 | uVar14 >> 0xe));
    uVar10 = uVar10 + lVar9;
    uVar21 = lVar9 + (uVar13 & uVar11 | (uVar13 | uVar11) & uVar12) +
                     ((uVar13 * 0x2000000 | uVar13 >> 0x27) ^
                     (uVar13 * 0x40000000 | uVar13 >> 0x22) ^ (uVar13 << 0x24 | uVar13 >> 0x1c));
    lVar9 = uVar20 + round_key[uVar18 + 0xb] + local_2c8[uVar18 + 0xd] +
            ((uVar14 ^ uVar16) & uVar10 ^ uVar16) +
            ((uVar10 * 0x800000 | uVar10 >> 0x29) ^
            (uVar10 << 0x2e | uVar10 >> 0x12) ^ (uVar10 << 0x32 | uVar10 >> 0xe));
    uVar12 = uVar12 + lVar9;
    uVar19 = lVar9 + (uVar21 & uVar13 | (uVar21 | uVar13) & uVar11) +
                     ((uVar21 * 0x2000000 | uVar21 >> 0x27) ^
                     (uVar21 * 0x40000000 | uVar21 >> 0x22) ^ (uVar21 << 0x24 | uVar21 >> 0x1c));
    lVar9 = uVar16 + round_key[uVar18 + 0xc] + local_2c8[uVar18 + 0xe] +
            ((uVar10 ^ uVar14) & uVar12 ^ uVar14) +
            ((uVar12 * 0x800000 | uVar12 >> 0x29) ^
            (uVar12 << 0x2e | uVar12 >> 0x12) ^ (uVar12 << 0x32 | uVar12 >> 0xe));
    uVar11 = uVar11 + lVar9;
    uVar17 = (uVar19 & uVar21 | (uVar19 | uVar21) & uVar13) +
             ((uVar19 * 0x2000000 | uVar19 >> 0x27) ^
             (uVar19 * 0x40000000 | uVar19 >> 0x22) ^ (uVar19 << 0x24 | uVar19 >> 0x1c)) + lVar9;
    lVar9 = uVar14 + round_key[uVar18 + 0xd] + local_2c8[uVar18 + 0xf] +
            ((uVar12 ^ uVar10) & uVar11 ^ uVar10) +
            ((uVar11 * 0x800000 | uVar11 >> 0x29) ^
            (uVar11 << 0x2e | uVar11 >> 0x12) ^ (uVar11 << 0x32 | uVar11 >> 0xe));
    uVar13 = uVar13 + lVar9;
    uVar15 = (uVar17 & uVar19 | (uVar17 | uVar19) & uVar21) +
             ((uVar17 * 0x2000000 | uVar17 >> 0x27) ^
             (uVar17 * 0x40000000 | uVar17 >> 0x22) ^ (uVar17 << 0x24 | uVar17 >> 0x1c)) + lVar9;
    lVar9 = local_2c8[uVar18 + 0x10] + round_key[uVar18 + 0xe] + uVar10 +
            ((uVar11 ^ uVar12) & uVar13 ^ uVar12) +
            ((uVar13 * 0x800000 | uVar13 >> 0x29) ^
            (uVar13 << 0x2e | uVar13 >> 0x12) ^ (uVar13 << 0x32 | uVar13 >> 0xe));
    uVar22 = uVar21 + lVar9;
    uVar10 = (uVar15 & uVar17 | (uVar15 | uVar17) & uVar19) +
             ((uVar15 * 0x2000000 | uVar15 >> 0x27) ^
             (uVar15 * 0x40000000 | uVar15 >> 0x22) ^ (uVar15 << 0x24 | uVar15 >> 0x1c)) + lVar9;
    lVar9 = local_2c8[uVar18 + 0x11] + round_key[uVar18 + 0xf] + uVar12 +
            ((uVar13 ^ uVar11) & uVar22 ^ uVar11) +
            ((uVar22 * 0x800000 | uVar22 >> 0x29) ^
            (uVar22 << 0x2e | uVar22 >> 0x12) ^ (uVar22 << 0x32 | uVar22 >> 0xe));
    uVar20 = uVar19 + lVar9;
    uVar12 = (uVar10 & uVar15 | (uVar10 | uVar15) & uVar17) +
             ((uVar10 * 0x2000000 | uVar10 >> 0x27) ^
             (uVar10 * 0x40000000 | uVar10 >> 0x22) ^ (uVar10 << 0x24 | uVar10 >> 0x1c)) + lVar9;
    uVar18 = uVar18 + 8;
  } while (uVar18 < 0x48);
  *state = uVar12 + uVar1;
  state[1] = uVar10 + uVar2;
  state[2] = uVar15 + uVar3;
  state[3] = uVar17 + uVar4;
  state[4] = uVar20 + uVar5;
  state[5] = uVar22 + uVar6;
  state[6] = uVar13 + uVar7;
  state[7] = uVar11 + uVar8;
  return;
}

Assistant:

static void
compress(uint64_t state[8], const uint8_t buf[SHA512_BLOCK_SIZE])
{
	uint64_t W[80], t;
	uint64_t a, b, c, d, e, f, g, h;
	int i;

	a = state[0];
	b = state[1];
	c = state[2];
	d = state[3];
	e = state[4];
	f = state[5];
	g = state[6];
	h = state[7];

	for (i = 0; i < 16; i++)
		W[i] = load_be64(buf+8*i);

	for (i = 16; i < 80; i++)
		W[i] = W[i-16] + G0(W[i-15]) + W[i-7] + G1(W[i-2]);

	for (i = 0; i < 80; i += 8) {
		ROUND(i+0, a,b,c,d,e,f,g,h);
		ROUND(i+1, h,a,b,c,d,e,f,g);
		ROUND(i+2, g,h,a,b,c,d,e,f);
		ROUND(i+3, f,g,h,a,b,c,d,e);
		ROUND(i+4, e,f,g,h,a,b,c,d);
		ROUND(i+5, d,e,f,g,h,a,b,c);
		ROUND(i+6, c,d,e,f,g,h,a,b);
		ROUND(i+7, b,c,d,e,f,g,h,a);
	}

	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;
	state[5] += f;
	state[6] += g;
	state[7] += h;
}